

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

void __thiscall Server::load_module(Server *this,string *module)

{
  const_iterator cVar1;
  long *plVar2;
  mapped_type pvVar3;
  mapped_type *ppvVar4;
  code *pcVar5;
  long *plVar6;
  long *plVar7;
  long local_50;
  undefined4 uStack_48;
  undefined4 uStack_44;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&available_modules_abi_cxx11_._M_t,module);
  if ((_Rb_tree_header *)cVar1._M_node !=
      &available_modules_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    std::operator+(&local_40,"libmodule_",module);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_40);
    plVar6 = plVar2 + 2;
    if ((long *)*plVar2 == plVar6) {
      local_50 = *plVar6;
      uStack_48 = (undefined4)plVar2[3];
      uStack_44 = *(undefined4 *)((long)plVar2 + 0x1c);
      plVar7 = &local_50;
    }
    else {
      local_50 = *plVar6;
      plVar7 = (long *)*plVar2;
    }
    *plVar2 = (long)plVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    pvVar3 = (mapped_type)dlopen(plVar7,2);
    if (plVar7 != &local_50) {
      operator_delete(plVar7);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    ppvVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
              ::operator[](&this->loaded_modules,module);
    *ppvVar4 = pvVar3;
    pcVar5 = (code *)dlsym(pvVar3,"module_load");
    (*pcVar5)(this);
  }
  return;
}

Assistant:

void Server::load_module(std::string module) {
    if (available_modules.find(module) != available_modules.end()) {
        auto handle = dlopen(("libmodule_" + module + ".so").c_str(), RTLD_NOW);
        this->loaded_modules[module] = handle;
        auto module_load = (ModuleLoad) dlsym(handle, "module_load");
        module_load(this);
    }
}